

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O0

size_t __thiscall
llvm::cl::
opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::getOptionWidth(opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *this)

{
  size_t sVar1;
  opt<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_llvm::cl::parser<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  sVar1 = basic_parser_impl::getOptionWidth((basic_parser_impl *)&this->Parser,&this->super_Option);
  return sVar1;
}

Assistant:

size_t getOptionWidth() const override {
    return Parser.getOptionWidth(*this);
  }